

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall test_app::test_keywords(test_app *this)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  ostringstream ss;
  char *in_stack_ffffffffffffe898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8a0;
  undefined7 in_stack_ffffffffffffe8f8;
  undefined1 in_stack_ffffffffffffe8ff;
  string local_1528 [32];
  ostringstream local_1508 [376];
  string local_1390 [32];
  streamable local_1370;
  streamable local_1350;
  streamable local_1330;
  undefined1 local_1309;
  string local_1308 [32];
  ostringstream local_12e8 [376];
  string local_1170 [32];
  streamable local_1150;
  streamable local_1130;
  undefined1 local_1109;
  string local_1108 [32];
  ostringstream local_10e8 [376];
  string local_f70 [32];
  streamable local_f50;
  streamable local_f30;
  streamable local_f10;
  undefined1 local_ee9;
  string local_ee8 [32];
  ostringstream local_ec8 [376];
  string local_d50 [32];
  streamable local_d30;
  streamable local_d10;
  undefined1 local_ce9;
  string local_ce8 [32];
  ostringstream local_cc8 [376];
  string local_b50 [32];
  streamable local_b30;
  streamable local_b10;
  undefined1 local_ae9;
  string local_ae8 [32];
  ostringstream local_ac8 [376];
  string local_950 [32];
  streamable local_930;
  undefined1 local_909;
  string local_908 [32];
  ostringstream local_8e8 [376];
  string local_770 [32];
  streamable local_750;
  streamable local_730;
  undefined1 local_709;
  string local_708 [32];
  ostringstream local_6e8 [376];
  string local_570 [32];
  streamable local_550;
  undefined1 local_529;
  string local_528 [32];
  ostringstream local_508 [376];
  string local_390 [32];
  streamable local_370;
  undefined1 local_349;
  string local_348 [32];
  ostringstream local_328 [376];
  string local_1b0 [48];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::url_mapper::map(poVar3,(char *)local_180);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_1b0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_328);
    poVar3 = std::operator<<((ostream *)local_328,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x23c);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/en\"");
    local_349 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_348);
    local_349 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_370,"ru");
  cppcms::url_mapper::map(poVar3,(char *)local_180,(streamable *)"/foobar/bee/bylang;lang");
  cppcms::filters::streamable::~streamable(&local_370);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_390);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_508);
    poVar3 = std::operator<<((ostream *)local_508,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x23e);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/ru\"");
    local_529 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_528);
    local_529 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_550,"ru");
  cppcms::url_mapper::map(poVar3,(char *)local_180,(streamable *)"/foobar/bee/byloc;lang");
  cppcms::filters::streamable::~streamable(&local_550);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_570);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_6e8);
    poVar3 = std::operator<<((ostream *)local_6e8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x240);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/ru_US\"");
    local_709 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_708);
    local_709 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_730,"ru");
  cppcms::filters::streamable::streamable(&local_750,"RU");
  cppcms::url_mapper::map
            (poVar3,(char *)local_180,(streamable *)"/foobar/bee/byloc;lang,terr",&local_730);
  cppcms::filters::streamable::~streamable(&local_750);
  cppcms::filters::streamable::~streamable(&local_730);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_770);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_8e8);
    poVar3 = std::operator<<((ostream *)local_8e8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x242);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/ru_RU\"");
    local_909 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_908);
    local_909 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_930,"RU");
  cppcms::url_mapper::map(poVar3,(char *)local_180,(streamable *)"/foobar/bee/byloc;terr");
  cppcms::filters::streamable::~streamable(&local_930);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_950);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_ac8);
    poVar3 = std::operator<<((ostream *)local_ac8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x244);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/en_RU\"");
    local_ae9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_ae8);
    local_ae9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_b10,"UA");
  cppcms::filters::streamable::streamable(&local_b30,"ru");
  cppcms::url_mapper::map
            (poVar3,(char *)local_180,(streamable *)"/foobar/bee/byloc;terr,lang",&local_b10);
  cppcms::filters::streamable::~streamable(&local_b30);
  cppcms::filters::streamable::~streamable(&local_b10);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_b50);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_cc8);
    poVar3 = std::operator<<((ostream *)local_cc8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x246);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/ru_UA\"");
    local_ce9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_ce8);
    local_ce9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_d10,"ru");
  cppcms::filters::streamable::streamable(&local_d30,"foo");
  cppcms::url_mapper::map
            (poVar3,(char *)local_180,(streamable *)"/foobar/bee/byloc;lang",&local_d10);
  cppcms::filters::streamable::~streamable(&local_d30);
  cppcms::filters::streamable::~streamable(&local_d10);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_d50);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_ec8);
    poVar3 = std::operator<<((ostream *)local_ec8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x248);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/ru_US/foo\"");
    local_ee9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_ee8);
    local_ee9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_f10,"ru");
  cppcms::filters::streamable::streamable(&local_f30,"RU");
  cppcms::filters::streamable::streamable(&local_f50,"foo");
  cppcms::url_mapper::map
            (poVar3,(char *)local_180,(streamable *)"/foobar/bee/byloc;lang,terr",&local_f10,
             &local_f30);
  cppcms::filters::streamable::~streamable(&local_f50);
  cppcms::filters::streamable::~streamable(&local_f30);
  cppcms::filters::streamable::~streamable(&local_f10);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_f70);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_10e8);
    poVar3 = std::operator<<((ostream *)local_10e8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24a);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/ru_RU/foo\"");
    local_1109 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1108);
    local_1109 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_1130,"RU");
  cppcms::filters::streamable::streamable(&local_1150,"foo");
  cppcms::url_mapper::map
            (poVar3,(char *)local_180,(streamable *)"/foobar/bee/byloc;terr",&local_1130);
  cppcms::filters::streamable::~streamable(&local_1150);
  cppcms::filters::streamable::~streamable(&local_1130);
  value((ostringstream *)CONCAT17(in_stack_ffffffffffffe8ff,in_stack_ffffffffffffe8f8));
  bVar2 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_1170);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_12e8);
    poVar3 = std::operator<<((ostream *)local_12e8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24c);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/en_RU/foo\"");
    local_1309 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1308);
    local_1309 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(&local_1330,"UA");
  cppcms::filters::streamable::streamable(&local_1350,"ru");
  cppcms::filters::streamable::streamable(&local_1370,"foo");
  cppcms::url_mapper::map
            (poVar3,(char *)local_180,(streamable *)"/foobar/bee/byloc;terr,lang",&local_1330,
             &local_1350);
  cppcms::filters::streamable::~streamable(&local_1370);
  cppcms::filters::streamable::~streamable(&local_1350);
  cppcms::filters::streamable::~streamable(&local_1330);
  value((ostringstream *)CONCAT17(bVar2,in_stack_ffffffffffffe8f8));
  bVar1 = std::operator==(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::__cxx11::string::~string(local_1390);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1508);
    poVar3 = std::operator<<((ostream *)local_1508,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24e);
    std::operator<<(poVar3," value(ss)==\"xx/foobar/bee/ru_UA/foo\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1528);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_keywords()
	{
		std::ostringstream ss;
		mapper().map(ss,"/foobar/bee/bylang");
		TEST(value(ss)=="xx/foobar/bee/en");
		mapper().map(ss,"/foobar/bee/bylang;lang","ru");
		TEST(value(ss)=="xx/foobar/bee/ru");
		mapper().map(ss,"/foobar/bee/byloc;lang","ru");
		TEST(value(ss)=="xx/foobar/bee/ru_US");
		mapper().map(ss,"/foobar/bee/byloc;lang,terr","ru","RU");
		TEST(value(ss)=="xx/foobar/bee/ru_RU");
		mapper().map(ss,"/foobar/bee/byloc;terr","RU");
		TEST(value(ss)=="xx/foobar/bee/en_RU");
		mapper().map(ss,"/foobar/bee/byloc;terr,lang","UA","ru");
		TEST(value(ss)=="xx/foobar/bee/ru_UA");
		mapper().map(ss,"/foobar/bee/byloc;lang","ru","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_US/foo");
		mapper().map(ss,"/foobar/bee/byloc;lang,terr","ru","RU","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_RU/foo");
		mapper().map(ss,"/foobar/bee/byloc;terr","RU","foo");
		TEST(value(ss)=="xx/foobar/bee/en_RU/foo");
		mapper().map(ss,"/foobar/bee/byloc;terr,lang","UA","ru","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_UA/foo");
	}